

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

bool Js::JavascriptError::ThrowIfStrictModeUndefinedSetter
               (PropertyOperationFlags flags,Var setterValue,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  ScriptContext *scriptContext_local;
  Var setterValue_local;
  PropertyOperationFlags flags_local;
  
  if (((flags & PropertyOperation_StrictMode) == PropertyOperation_None) ||
     (bVar1 = Js::JavascriptOperators::IsUndefinedAccessor(setterValue,scriptContext), !bVar1)) {
    setterValue_local._7_1_ = false;
  }
  else {
    this = ScriptContext::GetThreadContext(scriptContext);
    bVar1 = ThreadContext::RecordImplicitException(this);
    if (bVar1) {
      ThrowTypeError(scriptContext,-0x7ff5ec4b,(PCWSTR)0x0);
    }
    setterValue_local._7_1_ = true;
  }
  return setterValue_local._7_1_;
}

Assistant:

bool JavascriptError::ThrowIfStrictModeUndefinedSetter(
        PropertyOperationFlags flags, Var setterValue, ScriptContext* scriptContext)
    {
        if ((flags & PropertyOperation_StrictMode)
            && JavascriptOperators::IsUndefinedAccessor(setterValue, scriptContext))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_CantAssignToReadOnly);
            }
            return true;
        }
        return false;
    }